

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errno.c
# Opt level: O2

int main(void)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  *piVar1 = 0x22;
  return 0;
}

Assistant:

int main( void )
{
    errno = 0;
    TESTCASE( errno == 0 );
    errno = EDOM;
    TESTCASE( errno == EDOM );
    errno = ERANGE;
    TESTCASE( errno == ERANGE );

#if ! defined( REGTEST ) && __STDC_VERSION__ >= 201112L && ! defined( __STDC_NO_THREADS__ )
    {
        thrd_t t;
        struct timespec spec = { 1, 0 };
        int rc;

        TESTCASE( thrd_create( &t, thread_func, NULL ) == thrd_success );

        TESTCASE( thrd_sleep( &spec, NULL ) == 0 );
        TESTCASE( errno == ERANGE );
        TESTCASE( thrd_join( t, &rc ) == thrd_success );
        TESTCASE( rc == 0 );
    }
#endif

    return TEST_RESULTS;
}